

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

bool __thiscall Minisat::Solver::addClause_(Solver *this,vec<Minisat::Lit,_int> *ps)

{
  byte bVar1;
  uint uVar2;
  Lit *pLVar3;
  lbool *plVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  CRef CVar9;
  long lVar10;
  Size nelems;
  long lVar11;
  int iVar12;
  byte bVar13;
  uint uVar14;
  bool bVar15;
  CRef cr;
  CRef local_34;
  
  if ((this->trail_lim).sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/core/Solver.cc"
                  ,0x9c,"bool Minisat::Solver::addClause_(vec<Lit> &)");
  }
  bVar15 = false;
  nelems = 0;
  if (this->ok == true) {
    sort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>(ps->data,ps->sz);
    bVar8 = l_False;
    bVar7 = l_True;
    if (0 < ps->sz) {
      pLVar3 = ps->data;
      plVar4 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
               data;
      bVar5 = l_True & 2;
      bVar6 = l_False & 2;
      lVar11 = 0;
      uVar14 = 0xfffffffe;
      iVar12 = 0;
      do {
        uVar2 = pLVar3[lVar11].x;
        if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz
            <= (int)uVar2 >> 1) {
          __assert_fail("has(k)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/IntMap.h"
                        ,0x27,
                        "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                       );
        }
        bVar1 = plVar4[(int)uVar2 >> 1].value;
        bVar13 = (byte)uVar2 & 1 ^ bVar1;
        if (bVar13 == bVar7 && bVar5 == 0 || (bVar1 & bVar7 & 2) != 0) {
          return true;
        }
        if ((uVar2 ^ uVar14) == 1) {
          return true;
        }
        if (((bVar13 != bVar8 || bVar6 != 0) && (bVar1 & bVar8 & 2) == 0) && (uVar2 != uVar14)) {
          lVar10 = (long)iVar12;
          iVar12 = iVar12 + 1;
          pLVar3[lVar10].x = uVar2;
          uVar14 = uVar2;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < ps->sz);
      nelems = (int)lVar11 - iVar12;
    }
    vec<Minisat::Lit,_int>::shrink(ps,nelems);
    if (ps->sz == 1) {
      uncheckedEnqueue(this,(Lit)ps->data->x,0xffffffff);
      CVar9 = propagate(this);
      bVar15 = CVar9 == 0xffffffff;
      this->ok = bVar15;
    }
    else if (ps->sz == 0) {
      this->ok = false;
      bVar15 = false;
    }
    else {
      local_34 = ClauseAllocator::alloc(&this->ca,ps,false);
      vec<unsigned_int,_int>::push(&this->clauses,&local_34);
      attachClause(this,local_34);
      bVar15 = true;
    }
  }
  return bVar15;
}

Assistant:

bool Solver::addClause_(vec<Lit>& ps)
{
    assert(decisionLevel() == 0);
    if (!ok) return false;

    // Check if clause is satisfied and remove false/duplicate literals:
    sort(ps);
    Lit p; int i, j;
    for (i = j = 0, p = lit_Undef; i < ps.size(); i++)
        if (value(ps[i]) == l_True || ps[i] == ~p)
            return true;
        else if (value(ps[i]) != l_False && ps[i] != p)
            ps[j++] = p = ps[i];
    ps.shrink(i - j);

    if (ps.size() == 0)
        return ok = false;
    else if (ps.size() == 1){
        uncheckedEnqueue(ps[0]);
        return ok = (propagate() == CRef_Undef);
    }else{
        CRef cr = ca.alloc(ps, false);
        clauses.push(cr);
        attachClause(cr);
    }

    return true;
}